

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeSorterRowkey(VdbeCursor *pCsr,Mem *pOut)

{
  undefined2 uVar1;
  int n;
  ushort uVar2;
  int iVar3;
  KeyInfo *pKVar4;
  int *piVar5;
  char *__dest;
  int *__src;
  
  if ((char)pCsr->szRow == '\0') {
    piVar5 = (int *)pCsr->seqCount;
    __src = piVar5 + 4;
  }
  else {
    if (*(char *)((long)&pCsr->szRow + 1) == '\0') {
      pKVar4 = (KeyInfo *)
               ((long)*(int *)(*(long *)(*(long *)&pCsr->seekResult + 0x10) + 4) * 0x50 +
               *(long *)(*(long *)&pCsr->seekResult + 0x18));
    }
    else {
      pKVar4 = pCsr->pKeyInfo;
    }
    __src = *(int **)(pKVar4 + 1);
    piVar5 = (int *)((long)&pKVar4->db + 4);
  }
  n = *piVar5;
  if (pOut->szMalloc < n) {
    iVar3 = sqlite3VdbeMemGrow(pOut,n,0);
    if (iVar3 != 0) {
      return 7;
    }
    __dest = pOut->z;
    uVar1 = pOut->flags;
    uVar2 = uVar1 & 0xbe00 | 0x10;
  }
  else {
    __dest = pOut->zMalloc;
    pOut->z = __dest;
    uVar2 = 0x10;
  }
  pOut->n = n;
  pOut->flags = uVar2;
  memcpy(__dest,__src,(long)n);
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterRowkey(const VdbeCursor *pCsr, Mem *pOut){
  VdbeSorter *pSorter = pCsr->pSorter;
  void *pKey; int nKey;           /* Sorter key to copy into pOut */

  pKey = vdbeSorterRowkey(pSorter, &nKey);
  if( sqlite3VdbeMemClearAndResize(pOut, nKey) ){
    return SQLITE_NOMEM;
  }
  pOut->n = nKey;
  MemSetTypeFlag(pOut, MEM_Blob);
  memcpy(pOut->z, pKey, nKey);

  return SQLITE_OK;
}